

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O2

void __thiscall sznet::net::KcpWithTcpClient::~KcpWithTcpClient(KcpWithTcpClient *this)

{
  MutexLock *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *pEVar2;
  uint __line;
  self *psVar3;
  char *__assertion;
  bool bVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_10e8 [8];
  MutexLockGuard lock;
  _Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_>
  local_10d8 [84];
  undefined1 local_118 [12];
  undefined1 local_108 [12];
  undefined1 local_f8 [12];
  Functor local_e8;
  TimerCallback local_c8;
  Functor local_a8;
  code *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  CloseCallback cb;
  KcpConnectionPtr kcpConn;
  TcpConnectionPtr tcpConn;
  
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_118,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_118._0_8_;
    file.m_size = local_118._8_4_;
    Logger::Logger((Logger *)local_10e8,file,0x3d);
    psVar3 = LogStream::operator<<((LogStream *)&lock,"KcpWithTcpClient::~KcpWithTcpClient[");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    psVar3 = LogStream::operator<<(psVar3,"] - tcp connector ");
    LogStream::operator<<
              (psVar3,(this->m_tcpConnector).
                      super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_10e8);
  }
  this_00 = &this->m_mutex;
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cb._M_invoker = (_Invoker_type)0x0;
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_10e8 = (undefined1  [8])this_00;
  MutexLock::lock(this_00);
  p_Var1 = (this->m_tcpConnection).
           super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = p_Var1->_M_use_count == 1;
  }
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
             &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->m_tcpConnection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)&cb._M_invoker,
             &(this->m_kcpConnection).
              super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)local_10e8);
  if (kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (g_logLevel < 3) {
      Logger::SourceFile::SourceFile<107>
                ((SourceFile *)local_108,
                 (char (*) [107])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_108._0_8_;
      file_00.m_size = local_108._8_4_;
      Logger::Logger((Logger *)local_10e8,file_00,0x5c);
      LogStream::operator<<((LogStream *)&lock,"m_tcpConnector release!!!");
      Logger::~Logger((Logger *)local_10e8);
    }
    Connector::stop((this->m_tcpConnector).
                    super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar2 = this->m_loop;
    local_10e8 = (undefined1  [8])detail::removeTcpConnector;
    std::__shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2> *)&lock,
               &(this->m_tcpConnector).
                super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<sznet::net::Connector>))(std::shared_ptr<sznet::net::Connector>const&)>,void>
              ((function<void()> *)&local_c8,
               (_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>
                *)local_10e8);
    EventLoop::runAfter(pEVar2,1.0,&local_c8);
    std::_Function_base::~_Function_base(&local_c8.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_10d8);
  }
  else {
    if (this->m_loop !=
        (EventLoop *)
        kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._vptr__Sp_counted_base) {
      __assertion = "m_loop == tcpConn->getLoop()";
      __line = 0x4e;
      goto LAB_00138aa7;
    }
    local_10e8 = (undefined1  [8])detail::removeTcpConnection;
    lock.m_mutex = (MutexLock *)this->m_loop;
    std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)local_78,
               (_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>
                *)local_10e8);
    pEVar2 = this->m_loop;
    local_88 = TcpConnection::setCloseCallback;
    local_80 = 0;
    std::
    _Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>
    ::
    _Bind<std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&>
              ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>
                *)local_10e8,(offset_in_TcpConnection_to_subr *)&local_88,
               (shared_ptr<sznet::net::TcpConnection> *)
               &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_78);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&local_e8,
               (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>
                *)local_10e8);
    EventLoop::runInLoop(pEVar2,&local_e8);
    std::_Function_base::~_Function_base(&local_e8.super__Function_base);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
                    *)local_10d8);
    if (bVar4) {
      TcpConnection::forceClose
                ((TcpConnection *)
                 kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Function_base::~_Function_base((_Function_base *)local_78);
  }
  if (cb._M_invoker == (_Invoker_type)0x0) {
    if (g_logLevel < 3) {
      Logger::SourceFile::SourceFile<107>
                ((SourceFile *)local_f8,
                 (char (*) [107])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_f8._0_8_;
      file_01.m_size = local_f8._8_4_;
      Logger::Logger((Logger *)local_10e8,file_01,0x71);
      LogStream::operator<<((LogStream *)&lock,"m_kcpConnector release!!!");
      Logger::~Logger((Logger *)local_10e8);
    }
  }
  else {
    if (this->m_loop != *(EventLoop **)(cb._M_invoker + 0x10)) {
      __assertion = "m_loop == kcpConn->getLoop()";
      __line = 99;
LAB_00138aa7:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                    ,__line,"sznet::net::KcpWithTcpClient::~KcpWithTcpClient()");
    }
    local_10e8 = (undefined1  [8])detail::removeKcpConnection;
    lock.m_mutex = (MutexLock *)this->m_loop;
    std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::KcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)local_78,
               (_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::KcpConnection>_&)>
                *)local_10e8);
    pEVar2 = this->m_loop;
    local_88 = KcpConnection::setKcpCloseCallback;
    local_80 = 0;
    std::
    _Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>))(std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>const&)>
    ::
    _Bind<std::shared_ptr<sznet::net::KcpConnection>&,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>&>
              ((_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>))(std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>const&)>
                *)local_10e8,(offset_in_KcpConnection_to_subr *)&local_88,
               (shared_ptr<sznet::net::KcpConnection> *)&cb._M_invoker,
               (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)local_78)
    ;
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>))(std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>const&)>,void>
              ((function<void()> *)&local_a8,
               (_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_&)>
                *)local_10e8);
    EventLoop::runInLoop(pEVar2,&local_a8);
    std::_Function_base::~_Function_base(&local_a8.super__Function_base);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_>
    ::~_Tuple_impl(local_10d8);
    if (bVar4) {
      TcpConnection::forceClose
                ((TcpConnection *)
                 kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Function_base::~_Function_base((_Function_base *)local_78);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kcpConn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tcpConn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_kcpConnection).
              super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&this->m_tcpCodec);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_tcpConnection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  MutexLock::~MutexLock(this_00);
  std::_Function_base::~_Function_base(&(this->m_kcpWriteCompleteCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_kcpMessageCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_kcpConnectionCallback).super__Function_base);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_tcpConnector).
              super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

KcpWithTcpClient::~KcpWithTcpClient()
{
	LOG_INFO << "KcpWithTcpClient::~KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
	TcpConnectionPtr tcpConn;
	KcpConnectionPtr kcpConn;
	// TCP & KCP �����Ƿ���KcpWithTcpClient(owner)���Գ���
	bool uniqueTcp = false;
	bool uniqueKcp = false;
	{
		MutexLockGuard lock(m_mutex);
		uniqueTcp = m_tcpConnection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		tcpConn = m_tcpConnection;
		uniqueKcp = m_kcpConnection.use_count() == 1;
		kcpConn = m_kcpConnection;
	}
	if (tcpConn)
	{
		assert(m_loop == tcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeTcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, tcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_tcpConnector release!!!";
		m_tcpConnector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeTcpConnector, m_tcpConnector));
	}
	if (kcpConn)
	{
		assert(m_loop == kcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		KcpCloseCallback cb = std::bind(&detail::removeKcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&KcpConnection::setKcpCloseCallback, kcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// kcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_kcpConnector release!!!";
	}
}